

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParsingConstructor
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  int iVar1;
  FieldGenerator *pFVar2;
  FieldDescriptor **ppFVar3;
  uint i_00;
  uint i_01;
  ulong uVar4;
  ulong extraout_RDX;
  int iVar5;
  char *__s;
  int i_2;
  java *this_00;
  int i_1;
  long lVar6;
  int i;
  long lVar7;
  allocator<char> local_69;
  MessageGenerator *local_68;
  FieldGeneratorMap *local_60;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  string local_50;
  
  sorted_fields.array_ = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  local_68 = this;
  io::Printer::Print(printer,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"initFields();\n");
  local_60 = &local_68->field_generators_;
  lVar6 = 0;
  iVar5 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(local_68->descriptor_ + 0x2c); lVar7 = lVar7 + 1) {
    pFVar2 = FieldGeneratorMap::get
                       (local_60,(FieldDescriptor *)
                                 (*(long *)(local_68->descriptor_ + 0x30) + lVar6));
    iVar1 = (*pFVar2->_vptr_FieldGenerator[3])(pFVar2);
    iVar5 = iVar5 + iVar1;
    lVar6 = lVar6 + 0x78;
  }
  iVar1 = (iVar5 + 0x1f) / 0x20;
  uVar4 = (long)(iVar5 + 0x1f) % 0x20 & 0xffffffff;
  this_00 = (java *)0x0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != (int)this_00; this_00 = (java *)(ulong)((int)this_00 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_50,this_00,(int)uVar4);
    io::Printer::Print(printer,"int mutable_$bit_field_name$ = 0;\n","bit_field_name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar4 = extraout_RDX;
  }
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print(printer,"try {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  __s = " unknownFields,";
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_69);
  io::Printer::Print(printer,
                     "case 0:\n  done = true;\n  break;\ndefault: {\n  if (!parseUnknownField(input,$unknown_fields$\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
                     ,"unknown_fields",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  for (lVar6 = 0; lVar6 < *(int *)(local_68->descriptor_ + 0x2c); lVar6 = lVar6 + 1) {
    ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar6);
    field = *ppFVar3;
    SimpleItoa_abi_cxx11_
              (&local_50,
               (protobuf *)
               (ulong)(*(int *)(field + 0x28) << 3 |
                      *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                               (ulong)*(uint *)(field + 0x2c) * 4)),i_00);
    io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Indent(printer);
    pFVar2 = FieldGeneratorMap::get(local_60,field);
    (*pFVar2->_vptr_FieldGenerator[0xb])(pFVar2,printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  break;\n}\n");
    if ((*(int *)(field + 0x30) == 3) && (*(int *)(field + 0x2c) - 0xdU < 0xfffffffc)) {
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(*(int *)(field + 0x28) * 8 + 2),i_01);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pFVar2 = FieldGeneratorMap::get(local_60,field);
      (*pFVar2->_vptr_FieldGenerator[0xc])(pFVar2,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e.getMessage()).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent(printer);
  for (lVar6 = 0; lVar6 < *(int *)(local_68->descriptor_ + 0x2c); lVar6 = lVar6 + 1) {
    ppFVar3 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar6);
    pFVar2 = FieldGeneratorMap::get(local_60,*ppFVar3);
    (*pFVar2->_vptr_FieldGenerator[0xd])(pFVar2,printer);
  }
  if (*(int *)(*(long *)(*(long *)(local_68->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print(printer,"makeExtensionsImmutable();\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&sorted_fields);
  return;
}

Assistant:

void MessageGenerator::GenerateParsingConstructor(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "initFields();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n"
    "default: {\n"
    "  if (!parseUnknownField(input,$unknown_fields$\n"
    "                         extensionRegistry, tag)) {\n"
    "    done = true;\n"  // it's an endgroup tag
    "  }\n"
    "  break;\n"
    "}\n",
    "unknown_fields", HasUnknownFields(descriptor_)
        ? " unknownFields," : "");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(tag));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(packed_tag));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e.getMessage()).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  // Make unknown fields immutable.
  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}